

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP4Reader::DoClose(BP4Reader *this,int transportIndex)

{
  int iVar1;
  long in_RDI;
  ScopedTimer __var2846;
  BP4Reader *in_stack_000006c0;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  allocator local_71;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  LogMode in_stack_ffffffffffffffa0;
  allocator local_49;
  string local_48 [4];
  int in_stack_ffffffffffffffbc;
  TransportMan *in_stack_ffffffffffffffc0;
  
  if (DoClose(int)::__var846 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoClose(int)::__var846);
    if (iVar1 != 0) {
      DoClose::__var846 = (void *)ps_timer_create_("BP4Reader::Close");
      __cxa_guard_release(&DoClose(int)::__var846);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Engine",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff90,"BP4Reader",&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff68,"Close",(allocator *)&stack0xffffffffffffff67);
  iVar1 = helper::Comm::Rank((Comm *)0xa25827);
  uVar2 = *(undefined4 *)(in_RDI + 0x764);
  helper::Log(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
              in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,
              in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  PerformGets(in_stack_000006c0);
  Engine::RemoveCreatedVars((Engine *)CONCAT44(iVar1,in_stack_ffffffffffffff30));
  transportman::TransportMan::CloseFiles(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  transportman::TransportMan::CloseFiles(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  transportman::TransportMan::CloseFiles(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer
            ((ScopedTimer *)CONCAT44(in_stack_ffffffffffffff14,uVar2));
  return;
}

Assistant:

void BP4Reader::DoClose(const int transportIndex)
{
    PERFSTUBS_SCOPED_TIMER("BP4Reader::Close");
    helper::Log("Engine", "BP4Reader", "Close", m_Name, 0, m_Comm.Rank(), 5, m_Verbosity,
                helper::LogMode::INFO);
    PerformGets();
    /* Remove all variables we created in the last step */
    RemoveCreatedVars();

    m_DataFileManager.CloseFiles();
    m_MDFileManager.CloseFiles();
    m_MDIndexFileManager.CloseFiles();
}